

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O2

void print_string(LispPTR x)

{
  ulong *puVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  puVar1 = (ulong *)NativeAligned4FromLAddr(x);
  uVar4 = *puVar1;
  uVar2 = (ulong)(((uint)uVar4 & 0xfffffff) * 2) + (long)Lisp_world;
  putchar(0x22);
  uVar4 = uVar4 >> 0x20 & 0xffff;
  while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
    putchar((uint)*(byte *)(uVar2 ^ 3));
    uVar2 = uVar2 + 1;
  }
  putchar(0x22);
  return;
}

Assistant:

void print_string(LispPTR x) {
  struct stringp *string_point;
  DLword st_length;
  DLbyte *string_base;

  int i;

  string_point = (struct stringp *)NativeAligned4FromLAddr(x);
  st_length = string_point->length;
  string_base = (DLbyte *)NativeAligned2FromLAddr(string_point->base);

  printf("%c", DOUBLEQUOTE); /* print %" */

  for (i = 1; i <= st_length; i++) {
    printf("%c", GETBYTE(string_base));
    string_base++;
  }

  printf("%c", DOUBLEQUOTE); /* print %" */
}